

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O2

qsizetype bm_find(uchar *cc,qsizetype l,qsizetype index,uchar *puc,qsizetype pl,uchar *skiptable)

{
  bool bVar1;
  qsizetype qVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if (pl == 0) {
    qVar2 = -1;
    if (index <= l) {
      qVar2 = index;
    }
    return qVar2;
  }
  lVar4 = 0;
  if (0 < pl) {
    lVar4 = pl;
  }
  pbVar3 = cc + pl + index + -1;
  do {
    if (cc + l <= pbVar3) {
      return -1;
    }
    uVar7 = (ulong)skiptable[*pbVar3];
    if (uVar7 == 0) {
      lVar5 = 0;
      lVar6 = -pl;
      while( true ) {
        if (-lVar5 == lVar4) {
          return (qsizetype)(pbVar3 + (1 - (long)(cc + lVar4)));
        }
        if (pbVar3[lVar5] != puc[lVar5 + pl + -1]) break;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + -1;
      }
      uVar7 = -lVar6;
      if ((ulong)skiptable[pbVar3[lVar5]] != pl) {
        uVar7 = 1;
      }
    }
    bVar1 = pbVar3 <= cc + l + -uVar7;
    pbVar3 = pbVar3 + uVar7;
  } while (bVar1);
  return -1;
}

Assistant:

static inline qsizetype bm_find(const uchar *cc, qsizetype l, qsizetype index, const uchar *puc,
                                qsizetype pl, const uchar *skiptable)
{
    if (pl == 0)
        return index > l ? -1 : index;
    const qsizetype pl_minus_one = pl - 1;

    const uchar *current = cc + index + pl_minus_one;
    const uchar *end = cc + l;
    while (current < end) {
        qsizetype skip = skiptable[*current];
        if (!skip) {
            // possible match
            while (skip < pl) {
                if (*(current - skip) != puc[pl_minus_one - skip])
                    break;
                skip++;
            }
            if (skip > pl_minus_one) // we have a match
                return (current - cc) - skip + 1;

            // in case we don't have a match we are a bit inefficient as we only skip by one
            // when we have the non matching char in the string.
            if (skiptable[*(current - skip)] == pl)
                skip = pl - skip;
            else
                skip = 1;
        }
        if (current > end - skip)
            break;
        current += skip;
    }
    return -1; // not found
}